

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

uint64_t MeCab::fingerprint(char *str,size_t size)

{
  uint32_t kFingerPrint32Seed;
  uint64_t result [2];
  uint32_t in_stack_00000038;
  int in_stack_0000003c;
  void *in_stack_00000040;
  uint64_t local_28 [5];
  
  memset(local_28,0,0x10);
  anon_unknown_15::MurmurHash3_x86_128(in_stack_00000040,in_stack_0000003c,in_stack_00000038,str);
  return local_28[0];
}

Assistant:

uint64_t fingerprint(const char *str, size_t size) {
  uint64_t result[2] = { 0 };
  const uint32_t kFingerPrint32Seed = 0xfd14deff;
  MurmurHash3_x86_128(str, size, kFingerPrint32Seed,
		      reinterpret_cast<char *>(result));
  return result[0];
}